

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_aef201::SetPermissions
               (string *filename,mode_t *perms,cmExecutionStatus *status)

{
  Status SVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  SVar1 = cmsys::SystemTools::SetPermissions(filename,*perms,false);
  if (SVar1.Kind_ != Success) {
    std::operator+(&local_40,"Failed to set permissions for ",filename);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_40);
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  return SVar1.Kind_ == Success;
}

Assistant:

bool SetPermissions(const std::string& filename, const mode_t& perms,
                    cmExecutionStatus& status)
{
  if (!cmSystemTools::SetPermissions(filename, perms)) {
    status.SetError("Failed to set permissions for " + filename);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  return true;
}